

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__jpeg_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  byte bVar2;
  stbi_uc sVar3;
  short sVar4;
  char cVar5;
  short sVar6;
  bool bVar7;
  int *piVar8;
  byte bVar9;
  uchar uVar10;
  short sVar11;
  int iVar12;
  stbi__uint32 sVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  stbi__jpeg *z;
  char *pcVar17;
  long lVar18;
  anon_struct_96_18_0d0905d3 *paVar19;
  void *pvVar20;
  code *pcVar21;
  void *pvVar22;
  undefined8 *puVar23;
  int iVar24;
  uint uVar25;
  long lVar26;
  undefined8 *puVar27;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar28;
  uint uVar29;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  int why;
  int why_00;
  undefined8 extraout_RDX;
  undefined8 uVar30;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  anon_struct_96_18_0d0905d3 *extraout_RDX_03;
  anon_struct_96_18_0d0905d3 *extraout_RDX_04;
  anon_struct_96_18_0d0905d3 *paVar31;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  stbi_uc *extraout_RDX_15;
  stbi_uc *extraout_RDX_16;
  stbi_uc *psVar32;
  stbi_uc **ppsVar33;
  undefined1 *puVar34;
  byte *pbVar35;
  stbi__context *psVar36;
  ulong uVar37;
  uint uVar38;
  long lVar39;
  stbi_uc *psVar40;
  ulong uVar41;
  int iVar42;
  uint uVar43;
  int iVar44;
  short *psVar45;
  long in_FS_OFFSET;
  bool bVar46;
  undefined1 auVar47 [16];
  stbi_uc *coutput [4];
  short data [64];
  int local_1bc;
  ulong local_188;
  stbi_uc *local_158 [5];
  anon_struct_96_18_0d0905d3 *local_130;
  int local_128;
  int local_124;
  int *local_120;
  stbi__uint32 *local_118;
  int *local_110;
  long local_108;
  stbi__uint32 *local_100;
  short local_f8 [4];
  long local_f0 [2];
  int local_e0 [44];
  
  local_100 = (stbi__uint32 *)x;
  z = (stbi__jpeg *)malloc(0x4888);
  if (z == (stbi__jpeg *)0x0) {
    *(char **)(in_FS_OFFSET + -0x20) = "outofmem";
    return (void *)0x0;
  }
  memset(z,0,0x4888);
  z->s = s;
  z->idct_block_kernel = stbi__idct_simd;
  z->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  z->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  s->img_n = 0;
  if ((uint)req_comp < 5) {
    paVar1 = z->img_comp;
    lVar18 = 0x46d8;
    do {
      psVar32 = z->huff_dc[0].fast + lVar18 + -8;
      psVar32[0] = '\0';
      psVar32[1] = '\0';
      psVar32[2] = '\0';
      psVar32[3] = '\0';
      psVar32[4] = '\0';
      psVar32[5] = '\0';
      psVar32[6] = '\0';
      psVar32[7] = '\0';
      psVar32[8] = '\0';
      psVar32[9] = '\0';
      psVar32[10] = '\0';
      psVar32[0xb] = '\0';
      psVar32[0xc] = '\0';
      psVar32[0xd] = '\0';
      psVar32[0xe] = '\0';
      psVar32[0xf] = '\0';
      lVar18 = lVar18 + 0x60;
    } while (lVar18 != 0x4858);
    z->restart_interval = 0;
    local_118 = (stbi__uint32 *)y;
    local_110 = comp;
    iVar12 = stbi__decode_jpeg_header(z,0);
    uVar25 = extraout_EDX;
    if (iVar12 == 0) {
LAB_00117d77:
      uVar38 = z->s->img_n;
    }
    else {
      bVar9 = stbi__get_marker(z);
      uVar38 = (uint)bVar9;
      local_120 = z->huff_ac[0].delta + 9;
      uVar30 = extraout_RDX;
LAB_00115e41:
      uVar25 = (uint)uVar30;
      if (uVar38 == 0xda) {
        iVar12 = stbi__get16be(z->s);
        psVar36 = z->s;
        pbVar35 = psVar36->img_buffer;
        paVar31 = extraout_RDX_03;
        if (pbVar35 < psVar36->img_buffer_end) {
LAB_00115ef5:
          psVar36->img_buffer = pbVar35 + 1;
          bVar9 = *pbVar35;
        }
        else {
          if (psVar36->read_from_callbacks != 0) {
            stbi__refill_buffer(psVar36);
            pbVar35 = psVar36->img_buffer;
            paVar31 = extraout_RDX_04;
            goto LAB_00115ef5;
          }
          bVar9 = 0;
        }
        z->scan_n = (uint)bVar9;
        if ((0xfb < (byte)(bVar9 - 5)) && ((int)(uint)bVar9 <= z->s->img_n)) {
          if (iVar12 != (uint)bVar9 * 2 + 6) {
            pcVar17 = "bad SOS len";
            goto LAB_00117d6e;
          }
          if (bVar9 != 0) {
            lVar18 = 0;
            do {
              psVar36 = z->s;
              pbVar35 = psVar36->img_buffer;
              if (pbVar35 < psVar36->img_buffer_end) {
LAB_00115f6e:
                psVar36->img_buffer = pbVar35 + 1;
                uVar38 = (uint)*pbVar35;
              }
              else {
                if (psVar36->read_from_callbacks != 0) {
                  stbi__refill_buffer(psVar36);
                  pbVar35 = psVar36->img_buffer;
                  goto LAB_00115f6e;
                }
                uVar38 = 0;
              }
              psVar36 = z->s;
              pbVar35 = psVar36->img_buffer;
              if (pbVar35 < psVar36->img_buffer_end) {
LAB_00115faa:
                psVar36->img_buffer = pbVar35 + 1;
                bVar9 = *pbVar35;
              }
              else {
                if (psVar36->read_from_callbacks != 0) {
                  stbi__refill_buffer(psVar36);
                  pbVar35 = psVar36->img_buffer;
                  goto LAB_00115faa;
                }
                bVar9 = 0;
              }
              uVar25 = z->s->img_n;
              if ((int)uVar25 < 1) {
                uVar41 = 0;
              }
              else {
                uVar41 = 0;
                paVar31 = paVar1;
                do {
                  if (paVar31->id == uVar38) goto LAB_00115fdd;
                  uVar41 = uVar41 + 1;
                  paVar31 = paVar31 + 1;
                } while (uVar25 != uVar41);
                uVar41 = (ulong)uVar25;
              }
LAB_00115fdd:
              if ((uint)uVar41 == uVar25) goto LAB_00117d77;
              uVar37 = uVar41 & 0xffffffff;
              paVar31 = (anon_struct_96_18_0d0905d3 *)(uVar37 * 0x60);
              z->img_comp[uVar37].hd = (uint)(bVar9 >> 4);
              if (0x3f < bVar9) {
                pcVar17 = "bad DC huff";
                goto LAB_00117d6e;
              }
              paVar31 = paVar1 + uVar37;
              paVar31->ha = bVar9 & 0xf;
              if (3 < (bVar9 & 0xf)) {
                pcVar17 = "bad AC huff";
                goto LAB_00117d6e;
              }
              z->order[lVar18] = (uint)uVar41;
              lVar18 = lVar18 + 1;
            } while (lVar18 < z->scan_n);
          }
          psVar36 = z->s;
          pbVar35 = psVar36->img_buffer;
          if (pbVar35 < psVar36->img_buffer_end) {
LAB_00116090:
            psVar36->img_buffer = pbVar35 + 1;
            uVar25 = (uint)*pbVar35;
          }
          else {
            if (psVar36->read_from_callbacks != 0) {
              stbi__refill_buffer(psVar36);
              pbVar35 = psVar36->img_buffer;
              goto LAB_00116090;
            }
            uVar25 = 0;
          }
          z->spec_start = uVar25;
          psVar36 = z->s;
          pbVar35 = psVar36->img_buffer;
          if (pbVar35 < psVar36->img_buffer_end) {
LAB_001160d3:
            psVar36->img_buffer = pbVar35 + 1;
            uVar25 = (uint)*pbVar35;
          }
          else {
            if (psVar36->read_from_callbacks != 0) {
              stbi__refill_buffer(psVar36);
              pbVar35 = psVar36->img_buffer;
              goto LAB_001160d3;
            }
            uVar25 = 0;
          }
          z->spec_end = uVar25;
          psVar36 = z->s;
          pbVar35 = psVar36->img_buffer;
          if (pbVar35 < psVar36->img_buffer_end) {
LAB_00116116:
            psVar36->img_buffer = pbVar35 + 1;
            bVar9 = *pbVar35;
          }
          else {
            if (psVar36->read_from_callbacks != 0) {
              stbi__refill_buffer(psVar36);
              pbVar35 = psVar36->img_buffer;
              goto LAB_00116116;
            }
            bVar9 = 0;
          }
          z->succ_high = (uint)(bVar9 >> 4);
          uVar25 = bVar9 & 0xf;
          paVar31 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar25;
          z->succ_low = uVar25;
          iVar12 = z->progressive;
          iVar16 = z->spec_start;
          if (iVar12 == 0) {
            if (((iVar16 != 0) || (0xf < bVar9)) || ((bVar9 & 0xf) != 0)) goto LAB_001173ae;
            z->spec_end = 0x3f;
          }
          else if (((0x3f < iVar16) || (0x3f < z->spec_end)) ||
                  ((z->spec_end < iVar16 || ((0xdf < bVar9 || (0xd < uVar25)))))) {
LAB_001173ae:
            pcVar17 = "bad SOS";
            goto LAB_00117d6e;
          }
          iVar16 = z->scan_n;
          uVar41 = (ulong)(uint)z->restart_interval;
          if (z->restart_interval == 0) {
            uVar41 = 0x7fffffff;
          }
          z->code_buffer = 0;
          z->code_bits = 0;
          z->nomore = 0;
          z->img_comp[3].dc_pred = 0;
          z->img_comp[2].dc_pred = 0;
          z->img_comp[1].dc_pred = 0;
          z->img_comp[0].dc_pred = 0;
          z->marker = 0xff;
          uVar25 = (uint)uVar41;
          z->todo = uVar25;
          z->eob_run = 0;
          if (iVar12 == 0) {
            if (iVar16 == 1) {
              iVar16 = z->order[0];
              iVar42 = z->img_comp[iVar16].y + 7 >> 3;
              if (0 < iVar42) {
                uVar38 = paVar1[iVar16].x + 7 >> 3;
                local_188 = (ulong)uVar38;
                iVar14 = 0;
                iVar24 = 0;
                do {
                  if (0 < (int)uVar38) {
                    lVar18 = 0;
                    do {
                      iVar12 = stbi__jpeg_decode_block
                                         (z,local_f8,z->huff_dc + paVar1[iVar16].hd,
                                          z->huff_ac + paVar1[iVar16].ha,
                                          z->fast_ac[paVar1[iVar16].ha],iVar16,
                                          z->dequant[paVar1[iVar16].tq]);
                      if (iVar12 == 0) {
                        bVar46 = false;
                        local_1bc = 0;
                        uVar41 = extraout_RDX_07;
                      }
                      else {
                        (*z->idct_block_kernel)
                                  (paVar1[iVar16].data + lVar18 + iVar14 * paVar1[iVar16].w2,
                                   paVar1[iVar16].w2,local_f8);
                        iVar12 = z->todo;
                        z->todo = iVar12 + -1;
                        bVar46 = true;
                        uVar41 = extraout_RDX_08;
                        if (iVar12 < 2) {
                          if (z->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(z);
                            uVar41 = extraout_RDX_09;
                          }
                          if ((z->marker & 0xf8) == 0xd0) {
                            z->code_buffer = 0;
                            z->code_bits = 0;
                            z->nomore = 0;
                            z->img_comp[3].dc_pred = 0;
                            z->img_comp[2].dc_pred = 0;
                            z->img_comp[1].dc_pred = 0;
                            z->img_comp[0].dc_pred = 0;
                            z->marker = 0xff;
                            iVar12 = z->restart_interval;
                            uVar41 = 0x7fffffff;
                            if (iVar12 == 0) {
                              iVar12 = 0x7fffffff;
                            }
                            z->todo = iVar12;
                            z->eob_run = 0;
                          }
                          else {
                            local_1bc = 1;
                            bVar46 = false;
                          }
                        }
                      }
                      uVar25 = (uint)uVar41;
                      iVar12 = local_1bc;
                      if (!bVar46) goto LAB_00117247;
                      lVar18 = lVar18 + 8;
                    } while (local_188 * 8 != lVar18);
                  }
                  uVar25 = (uint)uVar41;
                  iVar24 = iVar24 + 1;
                  iVar14 = iVar14 + 8;
                } while (iVar24 != iVar42);
              }
LAB_00116fb6:
              iVar12 = 1;
            }
            else {
              iVar12 = 1;
              if (0 < z->img_mcu_y) {
                iVar16 = 0;
                do {
                  if (0 < z->img_mcu_x) {
                    local_1bc = 0;
                    do {
                      if (0 < z->scan_n) {
                        lVar18 = 0;
                        do {
                          iVar12 = z->order[lVar18];
                          if (0 < z->img_comp[iVar12].v) {
                            iVar42 = 0;
                            bVar46 = true;
                            do {
                              local_188 = CONCAT71(local_188._1_7_,bVar46);
                              iVar24 = paVar1[iVar12].h;
                              if (0 < iVar24) {
                                iVar14 = 0;
                                do {
                                  iVar44 = paVar1[iVar12].v;
                                  iVar15 = stbi__jpeg_decode_block
                                                     (z,local_f8,z->huff_dc + paVar1[iVar12].hd,
                                                      z->huff_ac + paVar1[iVar12].ha,
                                                      z->fast_ac[paVar1[iVar12].ha],iVar12,
                                                      z->dequant[paVar1[iVar12].tq]);
                                  uVar25 = (uint)extraout_RDX_11;
                                  if (iVar15 == 0) {
                                    uVar41 = extraout_RDX_11;
                                    if (bVar46 != false) goto LAB_00117227;
                                    goto LAB_0011712e;
                                  }
                                  (*z->idct_block_kernel)
                                            (paVar1[iVar12].data +
                                             (long)((iVar24 * local_1bc + iVar14) * 8) +
                                             (long)((iVar44 * iVar16 + iVar42) * paVar1[iVar12].w2 *
                                                   8),paVar1[iVar12].w2,local_f8);
                                  iVar14 = iVar14 + 1;
                                  iVar24 = paVar1[iVar12].h;
                                  uVar41 = extraout_RDX_12;
                                } while (iVar14 < iVar24);
                              }
                              iVar42 = iVar42 + 1;
                              bVar46 = iVar42 < paVar1[iVar12].v;
                            } while (iVar42 < paVar1[iVar12].v);
                          }
LAB_0011712e:
                          lVar18 = lVar18 + 1;
                        } while (lVar18 < z->scan_n);
                      }
                      uVar25 = (uint)uVar41;
                      iVar12 = z->todo;
                      z->todo = iVar12 + -1;
                      if (iVar12 < 2) {
                        if (z->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(z);
                          uVar25 = extraout_EDX_02;
                        }
                        iVar12 = 1;
                        if ((z->marker & 0xf8) != 0xd0) goto LAB_00117247;
                        z->code_buffer = 0;
                        z->code_bits = 0;
                        z->nomore = 0;
                        z->img_comp[3].dc_pred = 0;
                        z->img_comp[2].dc_pred = 0;
                        z->img_comp[1].dc_pred = 0;
                        z->img_comp[0].dc_pred = 0;
                        z->marker = 0xff;
                        iVar12 = z->restart_interval;
                        uVar41 = 0x7fffffff;
                        if (iVar12 == 0) {
                          iVar12 = 0x7fffffff;
                        }
                        z->todo = iVar12;
                        z->eob_run = 0;
                      }
                      local_1bc = local_1bc + 1;
                    } while (local_1bc < z->img_mcu_x);
                  }
                  uVar25 = (uint)uVar41;
                  iVar16 = iVar16 + 1;
                  iVar12 = 1;
                } while (iVar16 < z->img_mcu_y);
              }
            }
          }
          else if (iVar16 == 1) {
            local_108 = (long)z->order[0];
            local_124 = z->img_comp[local_108].y + 7 >> 3;
            iVar12 = 1;
            if (0 < local_124) {
              paVar31 = paVar1 + local_108;
              local_128 = z->img_comp[local_108].x + 7 >> 3;
              iVar16 = 0;
              local_130 = paVar31;
              do {
                if (0 < local_128) {
                  iVar12 = 0;
                  do {
                    local_1bc = iVar12;
                    piVar8 = local_120;
                    psVar45 = paVar31->coeff + (paVar31->coeff_w * iVar16 + local_1bc) * 0x40;
                    uVar37 = (ulong)z->spec_start;
                    if (uVar37 == 0) {
                      iVar12 = stbi__jpeg_decode_block_prog_dc
                                         (z,psVar45,z->huff_dc + paVar31->hd,(int)local_108);
                      uVar41 = extraout_RDX_05;
                      if (iVar12 != 0) goto LAB_001167a3;
                      bVar46 = false;
                      local_188 = 0;
                    }
                    else {
                      lVar18 = (long)paVar31->ha;
                      iVar12 = z->eob_run;
                      bVar9 = (byte)z->succ_low;
                      if (z->succ_high == 0) {
                        if (iVar12 == 0) {
                          do {
                            if (z->code_bits < 0x10) {
                              stbi__grow_buffer_unsafe(z);
                            }
                            sVar11 = z->fast_ac[lVar18][z->code_buffer >> 0x17];
                            uVar25 = (uint)sVar11;
                            iVar12 = (int)uVar37;
                            if (sVar11 == 0) {
                              if (z->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(z);
                              }
                              uVar25 = z->code_buffer;
                              uVar41 = (ulong)z->huff_ac[lVar18].fast[uVar25 >> 0x17];
                              if (uVar41 == 0xff) {
                                lVar26 = 0;
                                do {
                                  lVar39 = lVar26;
                                  lVar26 = lVar39 + 1;
                                } while ((uint)piVar8[lVar18 * 0x1a4 + lVar39 + -0x11] <=
                                         uVar25 >> 0x10);
                                iVar42 = z->code_bits;
                                if (lVar26 == 8) {
                                  z->code_bits = iVar42 + -0x10;
                                  uVar38 = 0xffffffff;
                                }
                                else {
                                  uVar38 = 0xffffffff;
                                  if (((int)(lVar39 + 10) <= iVar42) &&
                                     (uVar28 = (uVar25 >> (0x17U - (char)lVar26 & 0x1f) &
                                               stbi__bmask[lVar39 + 10]) +
                                               piVar8[lVar18 * 0x1a4 + lVar26], uVar28 < 0x100)) {
                                    bVar2 = z->huff_ac[lVar18].size[uVar28];
                                    if ((uVar25 >> (-bVar2 & 0x1f) & stbi__bmask[bVar2]) !=
                                        (uint)z->huff_ac[lVar18].code[uVar28]) goto LAB_00117dcd;
                                    z->code_bits = (iVar42 - (int)lVar26) + -9;
                                    z->code_buffer = uVar25 << ((byte)(lVar39 + 10) & 0x1f);
                                    uVar38 = (uint)z->huff_ac[lVar18].values[uVar28];
                                  }
                                }
                              }
                              else {
                                bVar2 = z->huff_ac[lVar18].size[uVar41];
                                uVar38 = 0xffffffff;
                                if ((int)(uint)bVar2 <= z->code_bits) {
                                  z->code_buffer = uVar25 << (bVar2 & 0x1f);
                                  z->code_bits = z->code_bits - (uint)bVar2;
                                  uVar38 = (uint)z->huff_ac[lVar18].values[uVar41];
                                }
                              }
                              if ((int)uVar38 < 0) {
                                *(char **)(in_FS_OFFSET + -0x20) = "bad huffman code";
                                iVar12 = 1;
                                bVar46 = false;
                              }
                              else {
                                uVar25 = uVar38 >> 4;
                                uVar28 = uVar38 & 0xf;
                                if ((uVar38 & 0xf) == 0) {
                                  if (uVar38 < 0xf0) {
                                    z->eob_run = 1 << ((byte)uVar25 & 0x1f);
                                    if (0xf < uVar38) {
                                      if (z->code_bits < (int)uVar25) {
                                        stbi__grow_buffer_unsafe(z);
                                      }
                                      uVar38 = 0;
                                      if ((int)uVar25 <= z->code_bits) {
                                        bVar2 = (byte)uVar25 & 0x1f;
                                        uVar38 = z->code_buffer << bVar2 |
                                                 z->code_buffer >> 0x20 - bVar2;
                                        uVar28 = stbi__bmask[uVar25];
                                        z->code_buffer = ~uVar28 & uVar38;
                                        uVar38 = uVar38 & uVar28;
                                        z->code_bits = z->code_bits - uVar25;
                                      }
                                      z->eob_run = z->eob_run + uVar38;
                                    }
                                    z->eob_run = z->eob_run + -1;
                                    iVar12 = 2;
                                    goto LAB_00116903;
                                  }
                                  uVar25 = iVar12 + 0x10;
                                }
                                else {
                                  bVar2 = ""[(long)iVar12 + (ulong)uVar25];
                                  if (z->code_bits < (int)uVar28) {
                                    stbi__grow_buffer_unsafe(z);
                                  }
                                  iVar42 = 0;
                                  if ((int)uVar28 <= z->code_bits) {
                                    uVar38 = z->code_buffer;
                                    uVar29 = uVar38 << (sbyte)uVar28 |
                                             uVar38 >> 0x20 - (sbyte)uVar28;
                                    uVar43 = *(uint *)((long)stbi__bmask + (ulong)(uVar28 << 2));
                                    z->code_buffer = ~uVar43 & uVar29;
                                    z->code_bits = z->code_bits - uVar28;
                                    iVar42 = 0;
                                    if (-1 < (int)uVar38) {
                                      iVar42 = *(int *)((long)stbi__jbias + (ulong)(uVar28 << 2));
                                    }
                                    iVar42 = (uVar29 & uVar43) + iVar42;
                                  }
                                  uVar25 = (int)((long)iVar12 + (ulong)uVar25) + 1;
                                  psVar45[bVar2] = (short)(iVar42 << (bVar9 & 0x1f));
                                }
                                uVar37 = (ulong)uVar25;
                                iVar12 = 0;
                                bVar46 = true;
                              }
                            }
                            else {
                              uVar28 = iVar12 + (uVar25 >> 4 & 0xf);
                              uVar37 = (ulong)uVar28;
                              uVar38 = uVar25 & 0xf;
                              if (z->code_bits < (int)uVar38) {
                                *(char **)(in_FS_OFFSET + -0x20) = "bad huffman code";
                                iVar12 = 1;
LAB_00116903:
                                bVar46 = false;
                              }
                              else {
                                z->code_buffer = z->code_buffer << (sbyte)uVar38;
                                z->code_bits = z->code_bits - uVar38;
                                uVar37 = (ulong)(uVar28 + 1);
                                psVar45[""[(int)uVar28]] = (short)((uVar25 >> 8) << (bVar9 & 0x1f));
                                iVar12 = 0 << (bVar9 & 0x1f);
                                bVar46 = true;
                              }
                            }
                            uVar41 = 0;
                            bVar7 = true;
                            if (iVar12 != 0) {
                              if (iVar12 != 2) {
                                bVar7 = bVar46;
                              }
                              break;
                            }
                          } while ((int)uVar37 <= z->spec_end);
                        }
                        else {
                          z->eob_run = iVar12 + -1;
                          uVar41 = 1;
                          bVar7 = false;
                        }
                        if (bVar7) goto LAB_0011677b;
                      }
                      else {
                        if (iVar12 == 0) {
                          iVar12 = 0x10000 << (bVar9 & 0x1f);
                          uVar25 = iVar12 >> 0x10;
                          do {
                            if (z->code_bits < 0x10) {
                              stbi__grow_buffer_unsafe(z);
                            }
                            uVar38 = z->code_buffer;
                            uVar41 = (ulong)z->huff_ac[lVar18].fast[uVar38 >> 0x17];
                            if (uVar41 == 0xff) {
                              lVar26 = 0;
                              do {
                                lVar39 = lVar26;
                                lVar26 = lVar39 + 1;
                              } while ((uint)piVar8[lVar18 * 0x1a4 + lVar39 + -0x11] <=
                                       uVar38 >> 0x10);
                              iVar42 = z->code_bits;
                              if (lVar26 == 8) {
                                z->code_bits = iVar42 + -0x10;
                                uVar28 = 0xffffffff;
                              }
                              else {
                                uVar28 = 0xffffffff;
                                if (((int)(lVar39 + 10) <= iVar42) &&
                                   (uVar43 = (uVar38 >> (0x17U - (char)lVar26 & 0x1f) &
                                             stbi__bmask[lVar39 + 10]) +
                                             piVar8[lVar18 * 0x1a4 + lVar26], uVar43 < 0x100)) {
                                  bVar9 = z->huff_ac[lVar18].size[uVar43];
                                  if ((uVar38 >> (-bVar9 & 0x1f) & stbi__bmask[bVar9]) !=
                                      (uint)z->huff_ac[lVar18].code[uVar43]) {
LAB_00117dcd:
                                    __assert_fail("(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mehedirm6244[P]sysfex/./lib/stb_image.h"
                                                  ,0x85b,
                                                  "int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)"
                                                 );
                                  }
                                  z->code_bits = (iVar42 - (int)lVar26) + -9;
                                  z->code_buffer = uVar38 << ((byte)(lVar39 + 10) & 0x1f);
                                  uVar28 = (uint)z->huff_ac[lVar18].values[uVar43];
                                }
                              }
                            }
                            else {
                              bVar9 = z->huff_ac[lVar18].size[uVar41];
                              uVar28 = 0xffffffff;
                              if ((int)(uint)bVar9 <= z->code_bits) {
                                z->code_buffer = uVar38 << (bVar9 & 0x1f);
                                z->code_bits = z->code_bits - (uint)bVar9;
                                uVar28 = (uint)z->huff_ac[lVar18].values[uVar41];
                              }
                            }
                            if ((int)uVar28 < 0) {
                              *(char **)(in_FS_OFFSET + -0x20) = "bad huffman code";
                              bVar46 = false;
                            }
                            else {
                              uVar38 = uVar28 >> 4;
                              if ((uVar28 & 0xf) == 1) {
                                if (z->code_bits < 1) {
                                  stbi__grow_buffer_unsafe(z);
                                }
                                uVar28 = -uVar25;
                                if (0 < z->code_bits) {
                                  sVar13 = z->code_buffer;
                                  z->code_buffer = sVar13 * 2;
                                  z->code_bits = z->code_bits + -1;
                                  if ((int)sVar13 < 0) {
                                    uVar28 = uVar25;
                                  }
                                }
                                sVar11 = (short)uVar28;
                                uVar43 = uVar38;
                              }
                              else {
                                if ((uVar28 & 0xf) != 0) {
                                  *(char **)(in_FS_OFFSET + -0x20) = "bad huffman code";
                                  bVar46 = false;
                                  goto LAB_00116766;
                                }
                                sVar11 = 0;
                                uVar43 = 0xf;
                                if (uVar28 < 0xf0) {
                                  z->eob_run = ~(-1 << ((byte)uVar38 & 0x1f));
                                  uVar43 = 0x40;
                                  sVar11 = 0;
                                  if (0xf < uVar28) {
                                    if (z->code_bits < (int)uVar38) {
                                      stbi__grow_buffer_unsafe(z);
                                    }
                                    sVar11 = 0;
                                    uVar28 = 0;
                                    if ((int)uVar38 <= z->code_bits) {
                                      bVar9 = (byte)uVar38 & 0x1f;
                                      uVar28 = z->code_buffer << bVar9 |
                                               z->code_buffer >> 0x20 - bVar9;
                                      uVar29 = stbi__bmask[uVar38];
                                      z->code_buffer = ~uVar29 & uVar28;
                                      uVar28 = uVar28 & uVar29;
                                      z->code_bits = z->code_bits - uVar38;
                                    }
                                    z->eob_run = z->eob_run + uVar28;
                                  }
                                }
                              }
                              uVar37 = (ulong)(int)uVar37;
                              do {
                                if ((long)z->spec_end < (long)uVar37) break;
                                bVar9 = ""[uVar37];
                                if (psVar45[bVar9] == 0) {
                                  if (uVar43 == 0) {
                                    psVar45[bVar9] = sVar11;
                                    bVar46 = false;
                                    uVar43 = 0;
                                  }
                                  else {
                                    uVar43 = uVar43 - 1;
                                    bVar46 = true;
                                  }
                                }
                                else {
                                  if (z->code_bits < 1) {
                                    stbi__grow_buffer_unsafe(z);
                                  }
                                  bVar46 = true;
                                  if (0 < z->code_bits) {
                                    sVar13 = z->code_buffer;
                                    z->code_buffer = sVar13 * 2;
                                    z->code_bits = z->code_bits + -1;
                                    if (((int)sVar13 < 0) &&
                                       (sVar4 = psVar45[bVar9], (uVar25 & (int)sVar4) == 0)) {
                                      sVar6 = (short)((uint)iVar12 >> 0x10);
                                      if (sVar4 < 1) {
                                        sVar6 = -sVar6;
                                      }
                                      psVar45[bVar9] = sVar4 + sVar6;
                                    }
                                  }
                                }
                                uVar37 = uVar37 + 1;
                              } while (bVar46);
                              bVar46 = true;
                            }
LAB_00116766:
                            if (!bVar46) {
                              uVar41 = 0;
                              goto LAB_00116780;
                            }
                          } while ((int)uVar37 <= z->spec_end);
                        }
                        else {
                          z->eob_run = iVar12 + -1;
                          if (z->spec_start <= z->spec_end) {
                            uVar25 = (0x10000 << (bVar9 & 0x1f)) >> 0x10;
                            do {
                              bVar9 = ""[uVar37];
                              if (psVar45[bVar9] != 0) {
                                if (z->code_bits < 1) {
                                  stbi__grow_buffer_unsafe(z);
                                }
                                if (0 < z->code_bits) {
                                  sVar13 = z->code_buffer;
                                  z->code_buffer = sVar13 * 2;
                                  z->code_bits = z->code_bits + -1;
                                  if (((int)sVar13 < 0) &&
                                     (sVar11 = psVar45[bVar9], (uVar25 & (int)sVar11) == 0)) {
                                    uVar38 = -uVar25;
                                    if (0 < sVar11) {
                                      uVar38 = uVar25;
                                    }
                                    psVar45[bVar9] = (short)uVar38 + sVar11;
                                  }
                                }
                              }
                              bVar46 = (long)uVar37 < (long)z->spec_end;
                              uVar37 = uVar37 + 1;
                            } while (bVar46);
                          }
                        }
LAB_0011677b:
                        uVar41 = 1;
                      }
LAB_00116780:
                      bVar46 = (int)uVar41 == 0;
                      if (bVar46) {
                        local_188._0_4_ = 0;
                      }
                      local_188 = (ulong)(uint)local_188;
                      if (bVar46) {
                        bVar46 = false;
                      }
                      else {
LAB_001167a3:
                        iVar12 = z->todo;
                        z->todo = iVar12 + -1;
                        bVar46 = true;
                        if (iVar12 < 2) {
                          if (z->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(z);
                            uVar41 = extraout_RDX_06;
                          }
                          if ((z->marker & 0xf8) == 0xd0) {
                            z->code_buffer = 0;
                            z->code_bits = 0;
                            z->nomore = 0;
                            z->img_comp[3].dc_pred = 0;
                            z->img_comp[2].dc_pred = 0;
                            z->img_comp[1].dc_pred = 0;
                            z->img_comp[0].dc_pred = 0;
                            z->marker = 0xff;
                            iVar12 = z->restart_interval;
                            uVar41 = 0x7fffffff;
                            if (iVar12 == 0) {
                              iVar12 = 0x7fffffff;
                            }
                            z->todo = iVar12;
                            z->eob_run = 0;
                          }
                          else {
                            local_188 = 1;
                            bVar46 = false;
                          }
                        }
                      }
                    }
                    uVar25 = (uint)uVar41;
                    if (!bVar46) {
                      iVar12 = (int)local_188;
                      goto LAB_00117247;
                    }
                    paVar31 = local_130;
                    iVar12 = local_1bc + 1;
                  } while (local_1bc + 1 != local_128);
                }
                uVar25 = (uint)uVar41;
                iVar12 = 1;
                iVar16 = iVar16 + 1;
              } while (iVar16 != local_124);
            }
          }
          else {
            iVar12 = 1;
            if (0 < z->img_mcu_y) {
              iVar12 = 0;
              do {
                if (0 < z->img_mcu_x) {
                  iVar16 = 0;
                  do {
                    if (0 < z->scan_n) {
                      lVar18 = 0;
                      do {
                        iVar42 = z->order[lVar18];
                        if (0 < z->img_comp[iVar42].v) {
                          iVar24 = 0;
                          bVar46 = true;
                          do {
                            iVar14 = paVar1[iVar42].h;
                            if (0 < iVar14) {
                              iVar44 = 0;
                              do {
                                iVar14 = stbi__jpeg_decode_block_prog_dc
                                                   (z,paVar1[iVar42].coeff +
                                                      (iVar14 * iVar16 + iVar44 +
                                                      (paVar1[iVar42].v * iVar12 + iVar24) *
                                                      paVar1[iVar42].coeff_w) * 0x40,
                                                    z->huff_dc + paVar1[iVar42].hd,iVar42);
                                uVar25 = (uint)extraout_RDX_10;
                                uVar41 = extraout_RDX_10;
                                if (iVar14 == 0) {
                                  if (bVar46) goto LAB_00117227;
                                  goto LAB_00116ee4;
                                }
                                iVar44 = iVar44 + 1;
                                iVar14 = paVar1[iVar42].h;
                              } while (iVar44 < iVar14);
                            }
                            iVar24 = iVar24 + 1;
                            bVar46 = iVar24 < paVar1[iVar42].v;
                          } while (iVar24 < paVar1[iVar42].v);
                        }
LAB_00116ee4:
                        lVar18 = lVar18 + 1;
                      } while (lVar18 < z->scan_n);
                    }
                    uVar25 = (uint)uVar41;
                    iVar42 = z->todo;
                    z->todo = iVar42 + -1;
                    if (iVar42 < 2) {
                      if (z->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(z);
                        uVar25 = extraout_EDX_01;
                      }
                      if ((z->marker & 0xf8) != 0xd0) goto LAB_00116fb6;
                      z->code_buffer = 0;
                      z->code_bits = 0;
                      z->nomore = 0;
                      z->img_comp[3].dc_pred = 0;
                      z->img_comp[2].dc_pred = 0;
                      z->img_comp[1].dc_pred = 0;
                      z->img_comp[0].dc_pred = 0;
                      z->marker = 0xff;
                      iVar42 = z->restart_interval;
                      uVar41 = 0x7fffffff;
                      if (iVar42 == 0) {
                        iVar42 = 0x7fffffff;
                      }
                      z->todo = iVar42;
                      z->eob_run = 0;
                    }
                    iVar16 = iVar16 + 1;
                  } while (iVar16 < z->img_mcu_x);
                }
                uVar25 = (uint)uVar41;
                iVar12 = iVar12 + 1;
              } while (iVar12 < z->img_mcu_y);
              goto LAB_00116fb6;
            }
          }
          goto LAB_00117247;
        }
        pcVar17 = "bad SOS component count";
LAB_00117d6e:
        uVar25 = (uint)paVar31;
        *(char **)(in_FS_OFFSET + -0x20) = pcVar17;
        goto LAB_00117d77;
      }
      if (uVar38 == 0xdc) goto LAB_00115e7a;
      if (uVar38 == 0xd9) {
        if ((z->progressive != 0) && (0 < z->s->img_n)) {
          lVar18 = 0;
          do {
            iVar12 = z->img_comp[lVar18].y + 7 >> 3;
            if (0 < iVar12) {
              uVar25 = paVar1[lVar18].x + 7 >> 3;
              iVar16 = 0;
              do {
                if (0 < (int)uVar25) {
                  uVar41 = 0;
                  do {
                    psVar45 = paVar1[lVar18].coeff +
                              (paVar1[lVar18].coeff_w * iVar16 + (int)uVar41) * 0x40;
                    iVar42 = paVar1[lVar18].tq;
                    lVar26 = 0;
                    do {
                      psVar45[lVar26] = psVar45[lVar26] * z->dequant[iVar42][lVar26];
                      lVar26 = lVar26 + 1;
                    } while (lVar26 != 0x40);
                    (*z->idct_block_kernel)
                              (paVar1[lVar18].data +
                               uVar41 * 8 + (long)(iVar16 * 8 * paVar1[lVar18].w2),paVar1[lVar18].w2
                               ,psVar45);
                    uVar41 = uVar41 + 1;
                    uVar30 = extraout_RDX_14;
                  } while (uVar41 != uVar25);
                }
                iVar16 = iVar16 + 1;
              } while (iVar16 != iVar12);
            }
            uVar25 = (uint)uVar30;
            lVar18 = lVar18 + 1;
          } while (lVar18 < z->s->img_n);
        }
      }
      else {
        iVar12 = stbi__process_marker(z,uVar38);
        uVar25 = extraout_EDX_00;
        if (iVar12 != 0) goto LAB_00115e6d;
      }
      if (req_comp == 0) {
        req_comp = (uint)(2 < z->s->img_n) * 2 + 1;
      }
      uVar38 = z->s->img_n;
      if (uVar38 == 3) {
        bVar46 = true;
        if (z->rgb != 3) {
          if (z->app14_color_transform != 0) goto LAB_001174ef;
          bVar46 = z->jfif == 0;
        }
      }
      else {
LAB_001174ef:
        bVar46 = false;
      }
      uVar28 = 1;
      if (bVar46) {
        uVar28 = uVar38;
      }
      if (2 < req_comp) {
        uVar28 = uVar38;
      }
      if (uVar38 != 3) {
        uVar28 = uVar38;
      }
      if (0 < (int)uVar28) {
        local_158[2] = (stbi_uc *)0x0;
        local_158[3] = (stbi_uc *)0x0;
        local_158[0] = (stbi_uc *)0x0;
        local_158[1] = (stbi_uc *)0x0;
        pvVar22 = (void *)0x0;
        lVar18 = 0;
        do {
          psVar36 = z->s;
          sVar13 = psVar36->img_x;
          pvVar20 = malloc((ulong)(sVar13 + 3));
          *(void **)((long)&z->img_comp[0].linebuf + lVar18 * 2) = pvVar20;
          if (pvVar20 == (void *)0x0) {
            stbi__free_jpeg_components(z,psVar36->img_n,why);
            *(char **)(in_FS_OFFSET + -0x20) = "outofmem";
          }
          else {
            uVar41 = (long)z->img_h_max / (long)*(int *)((long)&z->img_comp[0].h + lVar18 * 2);
            iVar12 = (int)uVar41;
            *(int *)((long)local_e0 + lVar18) = iVar12;
            iVar16 = z->img_v_max / *(int *)((long)&z->img_comp[0].v + lVar18 * 2);
            *(int *)((long)local_e0 + lVar18 + 4) = iVar16;
            *(int *)((long)local_e0 + lVar18 + 0xc) = iVar16 >> 1;
            *(int *)((long)local_e0 + lVar18 + 8) =
                 (int)((ulong)((sVar13 + iVar12) - 1) / (uVar41 & 0xffffffff));
            *(undefined4 *)((long)local_e0 + lVar18 + 0x10) = 0;
            uVar30 = *(undefined8 *)((long)&z->img_comp[0].data + lVar18 * 2);
            *(undefined8 *)((long)local_f0 + lVar18 + 8) = uVar30;
            *(undefined8 *)((long)local_f0 + lVar18) = uVar30;
            if ((iVar12 == 1) && (iVar16 == 1)) {
              *(code **)((long)local_f8 + lVar18) = resample_row_1;
            }
            else {
              if ((iVar12 == 1) && (iVar16 == 2)) {
                pcVar21 = stbi__resample_row_v_2;
              }
              else if ((iVar12 == 2) && (iVar16 == 1)) {
                pcVar21 = stbi__resample_row_h_2;
              }
              else if ((iVar12 == 2) && (iVar16 == 2)) {
                pcVar21 = z->resample_row_hv_2_kernel;
              }
              else {
                pcVar21 = stbi__resample_row_generic;
              }
              *(code **)((long)local_f8 + lVar18) = pcVar21;
            }
          }
          if (pvVar20 == (void *)0x0) goto LAB_00117d89;
          lVar18 = lVar18 + 0x30;
        } while ((ulong)uVar28 * 0x30 != lVar18);
        psVar36 = z->s;
        sVar13 = psVar36->img_y;
        pvVar22 = stbi__malloc_mad3(req_comp,psVar36->img_x,sVar13,1);
        if (pvVar22 != (void *)0x0) {
          iVar12 = why_00;
          if (sVar13 != 0) {
            iVar16 = 0;
            uVar25 = 0;
            do {
              sVar13 = psVar36->img_x;
              ppsVar33 = local_158;
              lVar18 = 0;
              do {
                puVar23 = (undefined8 *)((long)local_f0 + lVar18 + 8);
                iVar12 = *(int *)((long)local_e0 + lVar18 + 0xc);
                iVar42 = *(int *)((long)local_e0 + lVar18 + 4);
                iVar24 = iVar42 >> 1;
                puVar27 = puVar23;
                if (iVar12 < iVar24) {
                  puVar27 = (undefined8 *)((long)local_f0 + lVar18);
                }
                if (iVar24 <= iVar12) {
                  puVar23 = (undefined8 *)((long)local_f0 + lVar18);
                }
                auVar47 = (**(code **)((long)local_f8 + lVar18))
                                    (*(undefined8 *)((long)&z->img_comp[0].linebuf + lVar18 * 2),
                                     *puVar27,*puVar23,*(undefined4 *)((long)local_e0 + lVar18 + 8))
                ;
                psVar32 = auVar47._8_8_;
                *ppsVar33 = auVar47._0_8_;
                *(int *)((long)local_e0 + lVar18 + 0xc) = iVar12 + 1;
                if (iVar42 <= iVar12 + 1) {
                  *(undefined4 *)((long)local_e0 + lVar18 + 0xc) = 0;
                  lVar26 = *(long *)((long)local_f0 + lVar18 + 8);
                  *(long *)((long)local_f0 + lVar18) = lVar26;
                  iVar12 = *(int *)((long)local_e0 + lVar18 + 0x10) + 1;
                  *(int *)((long)local_e0 + lVar18 + 0x10) = iVar12;
                  if (iVar12 < *(int *)((long)&z->img_comp[0].y + lVar18 * 2)) {
                    *(long *)((long)local_f0 + lVar18 + 8) =
                         lVar26 + *(int *)((long)&z->img_comp[0].w2 + lVar18 * 2);
                  }
                }
                lVar18 = lVar18 + 0x30;
                ppsVar33 = ppsVar33 + 1;
              } while ((ulong)uVar28 * 0x30 != lVar18);
              if (req_comp < 3) {
                psVar36 = z->s;
                if (bVar46) {
                  if (req_comp == 1) {
                    if (psVar36->img_x != 0) {
                      uVar41 = 0;
                      do {
                        bVar9 = local_158[2][uVar41];
                        *(char *)((long)pvVar22 + uVar41 + sVar13 * iVar16) =
                             (char)((uint)bVar9 * 2 + ((uint)bVar9 + (uint)bVar9 * 8) * 3 +
                                    (uint)local_158[1][uVar41] * 0x96 +
                                    (uint)local_158[0][uVar41] * 0x4d >> 8);
                        uVar41 = uVar41 + 1;
                        psVar32 = local_158[1];
                      } while (uVar41 < psVar36->img_x);
                    }
                  }
                  else if (psVar36->img_x != 0) {
                    uVar41 = 0;
                    do {
                      bVar9 = local_158[2][uVar41];
                      *(char *)((long)pvVar22 + uVar41 * 2 + (ulong)(sVar13 * iVar16)) =
                           (char)((uint)bVar9 * 2 + ((uint)bVar9 + (uint)bVar9 * 8) * 3 +
                                  (uint)local_158[1][uVar41] * 0x96 +
                                  (uint)local_158[0][uVar41] * 0x4d >> 8);
                      *(undefined1 *)((long)pvVar22 + uVar41 * 2 + (ulong)(sVar13 * iVar16) + 1) =
                           0xff;
                      uVar41 = uVar41 + 1;
                      psVar32 = local_158[1];
                    } while (uVar41 < psVar36->img_x);
                  }
                }
                else if (psVar36->img_n == 4) {
                  if (z->app14_color_transform == 2) {
                    if (psVar36->img_x != 0) {
                      puVar34 = (undefined1 *)((long)pvVar22 + (ulong)(sVar13 * iVar16) + 1);
                      uVar41 = 0;
                      do {
                        iVar12 = (local_158[0][uVar41] ^ 0xff) * (uint)local_158[3][uVar41];
                        puVar34[-1] = (char)((iVar12 + 0x80U >> 8) + iVar12 + 0x80 >> 8);
                        *puVar34 = 0xff;
                        uVar41 = uVar41 + 1;
                        puVar34 = puVar34 + (uint)req_comp;
                        psVar32 = local_158[3];
                      } while (uVar41 < psVar36->img_x);
                    }
                  }
                  else {
                    if (z->app14_color_transform != 0) goto LAB_00117aad;
                    if (psVar36->img_x != 0) {
                      puVar34 = (undefined1 *)((long)pvVar22 + (ulong)(sVar13 * iVar16) + 1);
                      uVar41 = 0;
                      do {
                        bVar9 = local_158[3][uVar41];
                        iVar12 = (uint)local_158[0][uVar41] * (uint)bVar9;
                        iVar42 = (uint)local_158[1][uVar41] * (uint)bVar9;
                        puVar34[-1] = (char)(((uint)local_158[2][uVar41] * (uint)bVar9 +
                                              ((uint)local_158[2][uVar41] * (uint)bVar9 + 0x80 >> 8)
                                              + 0x80 >> 8 & 0xff) * 0x1d +
                                             (iVar42 + (iVar42 + 0x80U >> 8) + 0x80 >> 8 & 0xff) *
                                             0x96 + (iVar12 + (iVar12 + 0x80U >> 8) + 0x80 >> 8 &
                                                    0xff) * 0x4d >> 8);
                        *puVar34 = 0xff;
                        uVar41 = uVar41 + 1;
                        puVar34 = puVar34 + (uint)req_comp;
                        psVar32 = local_158[0];
                      } while (uVar41 < psVar36->img_x);
                    }
                  }
                }
                else {
LAB_00117aad:
                  uVar38 = psVar36->img_x;
                  psVar32 = (stbi_uc *)(ulong)uVar38;
                  if (req_comp == 1) {
                    if (uVar38 != 0) {
                      psVar32 = (stbi_uc *)0x0;
                      do {
                        psVar32[(ulong)(sVar13 * iVar16) + (long)pvVar22] =
                             local_158[0][(long)psVar32];
                        psVar32 = psVar32 + 1;
                      } while (psVar32 < (stbi_uc *)(ulong)psVar36->img_x);
                    }
                  }
                  else if (uVar38 != 0) {
                    psVar32 = (stbi_uc *)0x0;
                    do {
                      *(stbi_uc *)((long)pvVar22 + (long)psVar32 * 2 + (ulong)(sVar13 * iVar16)) =
                           local_158[0][(long)psVar32];
                      *(undefined1 *)
                       ((long)pvVar22 + (long)psVar32 * 2 + (ulong)(sVar13 * iVar16) + 1) = 0xff;
                      psVar32 = psVar32 + 1;
                    } while (psVar32 < (stbi_uc *)(ulong)psVar36->img_x);
                  }
                }
              }
              else {
                psVar40 = (stbi_uc *)((ulong)(uVar25 * req_comp * sVar13) + (long)pvVar22);
                psVar36 = z->s;
                if (psVar36->img_n == 3) {
                  if (bVar46) {
                    if (psVar36->img_x != 0) {
                      puVar34 = (undefined1 *)((long)pvVar22 + (ulong)(sVar13 * iVar16) + 3);
                      uVar41 = 0;
                      do {
                        puVar34[-3] = local_158[0][uVar41];
                        puVar34[-2] = local_158[1][uVar41];
                        puVar34[-1] = local_158[2][uVar41];
                        *puVar34 = 0xff;
                        uVar41 = uVar41 + 1;
                        puVar34 = puVar34 + (uint)req_comp;
                        psVar32 = local_158[2];
                      } while (uVar41 < psVar36->img_x);
                    }
                  }
                  else {
LAB_00117b1f:
                    (*z->YCbCr_to_RGB_kernel)
                              (psVar40,local_158[0],local_158[1],local_158[2],psVar36->img_x,
                               req_comp);
                    psVar32 = extraout_RDX_15;
                  }
                }
                else if (psVar36->img_n == 4) {
                  if (z->app14_color_transform == 2) {
                    (*z->YCbCr_to_RGB_kernel)
                              (psVar40,local_158[0],local_158[1],local_158[2],psVar36->img_x,
                               req_comp);
                    psVar36 = z->s;
                    psVar32 = extraout_RDX_16;
                    if (psVar36->img_x != 0) {
                      pbVar35 = (byte *)((long)pvVar22 + (ulong)(sVar13 * iVar16) + 2);
                      psVar32 = (stbi_uc *)0x0;
                      do {
                        bVar9 = local_158[3][(long)psVar32];
                        iVar12 = (pbVar35[-2] ^ 0xff) * (uint)bVar9;
                        pbVar35[-2] = (byte)((iVar12 + 0x80U >> 8) + iVar12 + 0x80 >> 8);
                        iVar12 = (pbVar35[-1] ^ 0xff) * (uint)bVar9;
                        pbVar35[-1] = (byte)((iVar12 + 0x80U >> 8) + iVar12 + 0x80 >> 8);
                        iVar12 = (*pbVar35 ^ 0xff) * (uint)bVar9;
                        *pbVar35 = (byte)((iVar12 + 0x80U >> 8) + iVar12 + 0x80 >> 8);
                        psVar32 = psVar32 + 1;
                        pbVar35 = pbVar35 + (uint)req_comp;
                      } while (psVar32 < (stbi_uc *)(ulong)psVar36->img_x);
                    }
                  }
                  else {
                    if (z->app14_color_transform != 0) goto LAB_00117b1f;
                    if (psVar36->img_x != 0) {
                      puVar34 = (undefined1 *)((long)pvVar22 + (ulong)(sVar13 * iVar16) + 3);
                      uVar41 = 0;
                      do {
                        bVar9 = local_158[3][uVar41];
                        iVar12 = (uint)local_158[0][uVar41] * (uint)bVar9;
                        puVar34[-3] = (char)((iVar12 + 0x80U >> 8) + iVar12 + 0x80 >> 8);
                        iVar12 = (uint)local_158[1][uVar41] * (uint)bVar9;
                        puVar34[-2] = (char)((iVar12 + 0x80U >> 8) + iVar12 + 0x80 >> 8);
                        puVar34[-1] = (char)(((uint)local_158[2][uVar41] * (uint)bVar9 + 0x80 >> 8)
                                             + (uint)local_158[2][uVar41] * (uint)bVar9 + 0x80 >> 8)
                        ;
                        *puVar34 = 0xff;
                        uVar41 = uVar41 + 1;
                        puVar34 = puVar34 + (uint)req_comp;
                        psVar32 = local_158[1];
                      } while (uVar41 < psVar36->img_x);
                    }
                  }
                }
                else if (psVar36->img_x != 0) {
                  puVar34 = (undefined1 *)((long)pvVar22 + (ulong)(sVar13 * iVar16) + 3);
                  psVar40 = (stbi_uc *)0x0;
                  do {
                    sVar3 = local_158[0][(long)psVar40];
                    puVar34[-1] = sVar3;
                    puVar34[-2] = sVar3;
                    puVar34[-3] = sVar3;
                    *puVar34 = 0xff;
                    psVar40 = psVar40 + 1;
                    psVar32 = (stbi_uc *)(ulong)psVar36->img_x;
                    puVar34 = puVar34 + (uint)req_comp;
                  } while (psVar40 < psVar32);
                }
              }
              iVar12 = (int)psVar32;
              uVar25 = uVar25 + 1;
              psVar36 = z->s;
              iVar16 = iVar16 + req_comp;
            } while (uVar25 < psVar36->img_y);
          }
          stbi__free_jpeg_components(z,psVar36->img_n,iVar12);
          psVar36 = z->s;
          *local_100 = psVar36->img_x;
          *local_118 = psVar36->img_y;
          if (local_110 != (int *)0x0) {
            *local_110 = (uint)(2 < psVar36->img_n) * 2 + 1;
          }
          goto LAB_00117d89;
        }
        stbi__free_jpeg_components(z,psVar36->img_n,why_00);
        pcVar17 = "outofmem";
        goto LAB_00115d75;
      }
    }
    stbi__free_jpeg_components(z,uVar38,uVar25);
  }
  else {
    pcVar17 = "bad req_comp";
LAB_00115d75:
    *(char **)(in_FS_OFFSET + -0x20) = pcVar17;
  }
  pvVar22 = (void *)0x0;
LAB_00117d89:
  free(z);
  return pvVar22;
LAB_00117227:
  iVar12 = 0;
LAB_00117247:
  if (iVar12 == 0) goto LAB_00117d77;
  paVar31 = paVar1;
  if (z->marker == 0xff) {
    do {
      psVar36 = z->s;
      if ((psVar36->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0011727e:
        if (psVar36->img_buffer_end <= psVar36->img_buffer) {
LAB_00117360:
          uVar10 = 0xff;
          break;
        }
      }
      else {
        iVar12 = (*(psVar36->io).eof)(psVar36->io_user_data);
        if (iVar12 != 0) {
          if (psVar36->read_from_callbacks != 0) goto LAB_0011727e;
          goto LAB_00117360;
        }
      }
      psVar36 = z->s;
      pbVar35 = psVar36->img_buffer;
      if (pbVar35 < psVar36->img_buffer_end) {
LAB_001172c0:
        psVar36->img_buffer = pbVar35 + 1;
        paVar19 = (anon_struct_96_18_0d0905d3 *)(ulong)*pbVar35;
      }
      else {
        if (psVar36->read_from_callbacks != 0) {
          stbi__refill_buffer(psVar36);
          pbVar35 = psVar36->img_buffer;
          goto LAB_001172c0;
        }
        paVar19 = (anon_struct_96_18_0d0905d3 *)0x0;
      }
      do {
        cVar5 = (char)paVar19;
        if (cVar5 != -1) {
          paVar19 = (anon_struct_96_18_0d0905d3 *)((ulong)paVar31 & 0xffffffff);
          break;
        }
        psVar36 = z->s;
        if ((psVar36->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001172f0:
          if (psVar36->img_buffer_end <= psVar36->img_buffer) {
LAB_00117345:
            paVar19 = (anon_struct_96_18_0d0905d3 *)0xff;
            break;
          }
        }
        else {
          iVar12 = (*(psVar36->io).eof)(psVar36->io_user_data);
          if (iVar12 != 0) {
            if (psVar36->read_from_callbacks != 0) goto LAB_001172f0;
            goto LAB_00117345;
          }
        }
        psVar36 = z->s;
        pbVar35 = psVar36->img_buffer;
        if (pbVar35 < psVar36->img_buffer_end) {
LAB_0011732a:
          psVar36->img_buffer = pbVar35 + 1;
          paVar19 = (anon_struct_96_18_0d0905d3 *)(ulong)*pbVar35;
        }
        else {
          if (psVar36->read_from_callbacks != 0) {
            stbi__refill_buffer(psVar36);
            pbVar35 = psVar36->img_buffer;
            goto LAB_0011732a;
          }
          paVar19 = (anon_struct_96_18_0d0905d3 *)0x0;
        }
      } while (0xfd < (byte)((char)paVar19 - 1U));
      uVar10 = (uchar)paVar19;
      paVar31 = paVar19;
    } while (cVar5 != -1);
    z->marker = uVar10;
  }
  bVar9 = stbi__get_marker(z);
  uVar38 = (uint)bVar9;
  uVar30 = extraout_RDX_13;
  if ((bVar9 & 0xf8) == 0xd0) {
LAB_00115e6d:
    bVar9 = stbi__get_marker(z);
    uVar38 = (uint)bVar9;
    uVar30 = extraout_RDX_00;
  }
  goto LAB_00115e41;
LAB_00115e7a:
  iVar12 = stbi__get16be(z->s);
  sVar13 = stbi__get16be(z->s);
  uVar30 = extraout_RDX_01;
  if (iVar12 == 4) {
    if (sVar13 == z->s->img_y) {
      bVar9 = stbi__get_marker(z);
      uVar38 = (uint)bVar9;
      bVar46 = true;
      uVar30 = extraout_RDX_02;
    }
    else {
      *(char **)(in_FS_OFFSET + -0x20) = "bad DNL height";
      uVar38 = 0xdc;
      bVar46 = false;
    }
  }
  else {
    *(char **)(in_FS_OFFSET + -0x20) = "bad DNL len";
    uVar38 = 0xdc;
    bVar46 = false;
  }
  uVar25 = (uint)uVar30;
  if (!bVar46) goto LAB_00117d77;
  goto LAB_00115e41;
}

Assistant:

static void *stbi__jpeg_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   unsigned char* result;
   stbi__jpeg* j = (stbi__jpeg*) stbi__malloc(sizeof(stbi__jpeg));
   if (!j) return stbi__errpuc("outofmem", "Out of memory");
   memset(j, 0, sizeof(stbi__jpeg));
   STBI_NOTUSED(ri);
   j->s = s;
   stbi__setup_jpeg(j);
   result = load_jpeg_image(j, x,y,comp,req_comp);
   STBI_FREE(j);
   return result;
}